

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

int try_disarm(trap *ttmp,boolean force_failure,schar dx,schar dy)

{
  xchar x_00;
  xchar y;
  monst *pmVar1;
  short sVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  obj *poVar8;
  long lVar9;
  char *pcVar10;
  trap *trap;
  long lVar11;
  monst *mtmp;
  xchar x;
  char *pcVar12;
  char cVar13;
  uint uVar14;
  xchar cy;
  xchar cx;
  xchar by;
  xchar bx;
  boolean local_35;
  int bc;
  
  pmVar1 = level->monsters[ttmp->tx][ttmp->ty];
  mtmp = (monst *)0x0;
  if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
    mtmp = pmVar1;
  }
  uVar14 = (byte)ttmp->field_0x8 & 0x1f;
  cVar13 = (char)uVar14;
  if (mtmp != (monst *)0x0) {
    if (((mtmp->field_0x62 & 0x80) != 0) && (cVar13 == '\x05' || cVar13 == '\x13'))
    goto LAB_0026e74a;
    pcVar10 = Monnam(mtmp);
    pcVar12 = "%s is in the way.";
LAB_0026e994:
    iVar4 = 0;
    goto LAB_0026ea14;
  }
LAB_0026e74a:
  poVar8 = sobj_at(0x214,level,(int)ttmp->tx,(int)ttmp->ty);
  if ((((poVar8 != (obj *)0x0) && (u.uprops[0x3e].intrinsic == 0)) &&
      (u.uprops[0x3e].extrinsic == 0)) &&
     ((dy != '\0' || dx != '\0' && (((youmonst.data)->mflags1 & 8) == 0)))) {
    pline("There is a boulder in your way.");
    return 0;
  }
  if (((dy == '\0' || dx == '\0') ||
      (bVar3 = bad_rock(youmonst.data,'\x01',u.ux,ttmp->ty), bVar3 == '\0')) ||
     (bVar3 = bad_rock(youmonst.data,'\x01',ttmp->tx,u.uy), bVar3 == '\0')) {
LAB_0026e84b:
    bVar3 = can_reach_floor();
    if (bVar3 != '\0') {
      if ((force_failure == '\0') && (iVar4 = untrap_prob(ttmp), iVar4 == 0)) {
        return 2;
      }
      uVar6 = mt_random();
      uVar6 = uVar6 % 5;
      lVar11 = (long)u.uluck;
      lVar9 = (long)u.moreluck;
      if (((int)(lVar9 + lVar11) == 0) ||
         (uVar7 = mt_random(), SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar9 + lVar11)),0) == 0)) {
LAB_0026e8fa:
        if (uVar6 == 0) {
LAB_0026e99b:
          pcVar10 = "That";
          if (dy == '\0' && dx == '\0') {
            pcVar10 = "This";
          }
          pcVar12 = "Your";
          if (-1 < (char)ttmp->field_0x8) {
            pcVar12 = pcVar10;
          }
          pcVar10 = "disarm";
          if (cVar13 == '\x13') {
            pcVar10 = "remove";
          }
          pline("%s %s is difficult to %s.",pcVar12,defexplain[(ulong)uVar14 + 0x2f],pcVar10);
          return 1;
        }
      }
      else {
        iVar4 = (int)u.moreluck + (int)u.uluck;
        if (-6 < iVar4) {
          sVar2 = (short)((uint)(iVar4 * 0x5556) >> 0x10);
          iVar4 = (int)(short)(sVar2 - (sVar2 >> 0xf));
        }
        uVar6 = uVar6 - iVar4;
        if ((int)uVar6 < 0) goto LAB_0026e99b;
        if (uVar6 < 5) goto LAB_0026e8fa;
      }
      pline("Whoops...");
      if (mtmp == (monst *)0x0) {
        if (dy == '\0' && dx == '\0') {
          dotrap(ttmp,0);
        }
        else {
          x_00 = ttmp->tx;
          y = ttmp->ty;
          if ((uball == (obj *)0x0) ||
             (bVar3 = drag_ball(x_00,y,&bc,&bx,&by,&cx,&cy,&local_35,'\x01'), bVar3 != '\0')) {
            iVar5 = (int)u.ux;
            u.ux0 = u.ux;
            iVar4 = (int)u.uy;
            u.uy0 = u.uy;
            u.umoved = '\x01';
            u.ux = x_00;
            u.uy = y;
            newsym(iVar5,iVar4);
            vision_recalc(1);
            check_leash(u.ux0,u.uy0);
            if (uball != (obj *)0x0) {
              move_bc(0,bc,bx,by,cx,cy);
            }
            spoteffects('\0');
            exercise(2,'\0');
          }
        }
        return 1;
      }
      if (cVar13 == '\x05') {
        if (mtmp->mtame != '\0') {
          abuse_dog(mtmp);
        }
        uVar14 = mt_random();
        iVar4 = (~uVar14 | 0xfffffffc) + mtmp->mhp;
        mtmp->mhp = iVar4;
        if (iVar4 < 1) {
          killed(mtmp);
          return 1;
        }
        return 1;
      }
      iVar4 = 1;
      if (cVar13 != '\x13') {
        return 1;
      }
      if (youmonst.data != mons + 100 && youmonst.data != mons + 0x62) {
        trap = maketrap(level,(int)u.ux,(int)u.uy,0x13);
        if (trap == (trap *)0x0) {
          return 1;
        }
        pline("The webbing sticks to you. You\'re caught too!");
        dotrap(trap,1);
        if (u.usteed != (monst *)0x0) {
          if (u.utrap != 0) {
            dismount_steed(1);
            return 1;
          }
          return 1;
        }
        return 1;
      }
      pcVar10 = Monnam(mtmp);
      pcVar12 = "%s remains entangled.";
      goto LAB_0026ea14;
    }
    if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
      pcVar10 = mon_nam(u.usteed);
      pcVar12 = "You aren\'t skilled enough to reach from %s.";
      goto LAB_0026e994;
    }
    pcVar10 = defexplain[(ulong)uVar14 + 0x2f];
  }
  else {
    if (invent == (obj *)0x0) {
LAB_0026e82f:
      if ((youmonst.data)->msize < 3) goto LAB_0026e84b;
    }
    else {
      iVar4 = inv_weight();
      iVar5 = weight_cap();
      if (iVar5 + iVar4 < 0x259) goto LAB_0026e82f;
    }
    pcVar10 = defexplain[(ulong)uVar14 + 0x2f];
  }
  pcVar12 = "You are unable to reach the %s!";
  iVar4 = 0;
LAB_0026ea14:
  pline(pcVar12,pcVar10);
  return iVar4;
}

Assistant:

static int try_disarm(struct trap *ttmp, boolean force_failure, schar dx, schar dy)
{
	struct monst *mtmp = m_at(level, ttmp->tx,ttmp->ty);
	int ttype = ttmp->ttyp;
	boolean under_u = (!dx && !dy);
	boolean holdingtrap = (ttype == BEAR_TRAP || ttype == WEB);
	
	/* Test for monster first, monsters are displayed instead of trap. */
	if (mtmp && (!mtmp->mtrapped || !holdingtrap)) {
		pline("%s is in the way.", Monnam(mtmp));
		return 0;
	}
	/* We might be forced to move onto the trap's location. */
	if (sobj_at(BOULDER, level, ttmp->tx, ttmp->ty)
				&& !Passes_walls && !under_u) {
		pline("There is a boulder in your way.");
		return 0;
	}
	/* duplicate tight-space checks from test_move */
	if (dx && dy &&
	    bad_rock(youmonst.data, TRUE, u.ux, ttmp->ty) &&
	    bad_rock(youmonst.data, TRUE, ttmp->tx, u.uy)) {
	    if ((invent && (inv_weight() + weight_cap() > 600)) ||
		bigmonst(youmonst.data)) {
		/* don't allow untrap if they can't get thru to it */
		pline("You are unable to reach the %s!",
		    trapexplain[ttype-1]);
		return 0;
	    }
	}
	/* untrappable traps are located on the ground. */
	if (!can_reach_floor()) {
		if (u.usteed && P_SKILL(P_RIDING) < P_BASIC)
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
		else
			pline("You are unable to reach the %s!",
			trapexplain[ttype-1]);
		return 0;
	}

	/* Will our hero succeed? */
	if (force_failure || untrap_prob(ttmp)) {
		if (rnl(5)) {
		    pline("Whoops...");
		    if (mtmp) {		/* must be a trap that holds monsters */
			if (ttype == BEAR_TRAP) {
			    if (mtmp->mtame) abuse_dog(mtmp);
			    if ((mtmp->mhp -= rnd(4)) <= 0) killed(mtmp);
			} else if (ttype == WEB) {
			    if (!webmaker(youmonst.data)) {
				struct trap *ttmp2 = maketrap(level, u.ux, u.uy, WEB);
				if (ttmp2) {
				    pline("The webbing sticks to you. You're caught too!");
				    dotrap(ttmp2, NOWEBMSG);
				    if (u.usteed && u.utrap) {
					/* you, not steed, are trapped */
					dismount_steed(DISMOUNT_FELL);
				    }
				}
			    } else
				pline("%s remains entangled.", Monnam(mtmp));
			}
		    } else if (under_u) {
			dotrap(ttmp, 0);
		    } else {
			move_into_trap(ttmp);
		    }
		} else {
		    pline("%s %s is difficult to %s.",
			  ttmp->madeby_u ? "Your" : under_u ? "This" : "That",
			  trapexplain[ttype-1],
			  (ttype == WEB) ? "remove" : "disarm");
		}
		return 1;
	}
	return 2;
}